

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitplane.cpp
# Opt level: O1

bool ConvexDecomposition::computeSplitPlane
               (uint vcount,float *vertices,uint tcount,uint *indices,
               ConvexDecompInterface *callback,float *plane)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  float fVar16;
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 auVar19 [64];
  float fVar20;
  float fVar21;
  undefined1 auVar22 [64];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  undefined1 extraout_var [60];
  
  if (vcount == 0) {
    auVar17 = ZEXT464(0x4e6e6b28);
    auVar22 = ZEXT464(0xce6e6b28);
    auVar14 = auVar22._0_16_;
    auVar19 = ZEXT1664(auVar17._0_16_);
    auVar12 = ZEXT1664(auVar17._0_16_);
    auVar11 = auVar14;
  }
  else {
    auVar15 = ZEXT464(0xce6e6b28);
    auVar12 = ZEXT464(0x4e6e6b28);
    uVar6 = 0;
    auVar19 = ZEXT1664(auVar12._0_16_);
    auVar17 = ZEXT1664(auVar12._0_16_);
    auVar14 = auVar15._0_16_;
    auVar22 = ZEXT1664(auVar14);
    do {
      uVar7 = uVar6 & 0xffffffff;
      auVar11 = vminss_avx(ZEXT416((uint)vertices[uVar7]),auVar17._0_16_);
      auVar17 = ZEXT1664(auVar11);
      auVar11 = vminss_avx(ZEXT416((uint)vertices[uVar7 + 1]),auVar19._0_16_);
      auVar19 = ZEXT1664(auVar11);
      auVar11 = vminss_avx(ZEXT416((uint)vertices[uVar7 + 2]),auVar12._0_16_);
      auVar12 = ZEXT1664(auVar11);
      auVar11 = vmaxss_avx(ZEXT416((uint)vertices[uVar7]),auVar22._0_16_);
      auVar22 = ZEXT1664(auVar11);
      auVar14 = vmaxss_avx(ZEXT416((uint)vertices[uVar7 + 1]),auVar14);
      auVar11 = vmaxss_avx(ZEXT416((uint)vertices[uVar7 + 2]),auVar15._0_16_);
      auVar15 = ZEXT1664(auVar11);
      uVar6 = uVar6 + 3;
    } while ((ulong)vcount * 3 != uVar6);
  }
  fVar16 = auVar17._0_4_;
  fVar21 = auVar22._0_4_;
  fVar23 = fVar21 - fVar16;
  fVar18 = auVar19._0_4_;
  fVar20 = auVar14._0_4_;
  fVar9 = fVar20 - fVar18;
  fVar10 = auVar12._0_4_;
  fVar13 = auVar11._0_4_;
  fVar8 = fVar13 - fVar10;
  uVar6 = vcmpps_avx512vl(ZEXT416((uint)fVar23),ZEXT416((uint)fVar8),1);
  uVar7 = vcmpps_avx512vl(ZEXT416((uint)fVar9),ZEXT416((uint)fVar8),1);
  cVar5 = '\x02';
  if ((uVar6 & uVar7 & 1) == 0) {
    cVar5 = fVar23 < fVar9;
  }
  auVar25 = SUB6416(ZEXT464(0x3f000000),0);
  auVar14 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar23),auVar17._0_16_);
  auVar11 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar9),auVar19._0_16_);
  fVar27 = auVar11._0_4_;
  auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar8),auVar12._0_16_);
  fVar26 = auVar14._0_4_;
  fVar24 = auVar25._0_4_;
  if (cVar5 == '\0') {
    bVar4 = fVar9 < fVar8;
    fVar8 = (float)((uint)bVar4 * (int)fVar10 + (uint)!bVar4 * (int)fVar13);
    fVar9 = (float)((uint)bVar4 * (int)fVar20 + (uint)!bVar4 * (int)fVar18);
    auVar17 = ZEXT1664(auVar14);
    fVar23 = fVar26;
  }
  else if (cVar5 == '\x01') {
    bVar4 = fVar8 < fVar23;
    auVar19 = ZEXT1664(auVar11);
    fVar23 = (float)((uint)bVar4 * (int)fVar21 + (uint)!bVar4 * (int)fVar16);
    fVar9 = fVar27;
    fVar8 = (float)((uint)bVar4 * (int)fVar10 + (uint)!bVar4 * (int)fVar13);
  }
  else {
    bVar4 = fVar9 < fVar23;
    fVar9 = (float)((uint)bVar4 * (int)fVar18 + (uint)!bVar4 * (int)fVar20);
    auVar12 = ZEXT1664(auVar25);
    fVar23 = (float)((uint)bVar4 * (int)fVar21 + (uint)!bVar4 * (int)fVar16);
    fVar8 = fVar24;
  }
  fVar23 = auVar17._0_4_ - fVar23;
  fVar9 = auVar19._0_4_ - fVar9;
  fVar8 = auVar12._0_4_ - fVar8;
  fVar10 = fVar26 - auVar17._0_4_;
  fVar13 = fVar27 - auVar19._0_4_;
  fVar16 = fVar24 - auVar12._0_4_;
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * fVar8)),ZEXT416((uint)fVar9),
                           ZEXT416((uint)fVar16));
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar23)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)fVar8));
  fVar8 = auVar11._0_4_;
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar9)),ZEXT416((uint)fVar23),
                           ZEXT416((uint)fVar13));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8)),auVar2,auVar2);
  auVar11 = vfmadd231ss_fma(auVar11,auVar3,auVar3);
  if (auVar11._0_4_ < 0.0) {
    auVar12._0_4_ = sqrtf(auVar11._0_4_);
    auVar12._4_60_ = extraout_var;
    auVar11 = auVar12._0_16_;
    auVar14 = ZEXT416((uint)fVar26);
    auVar25 = ZEXT416((uint)fVar24);
  }
  else {
    auVar11 = vsqrtss_avx(auVar11,auVar11);
  }
  uVar1 = vcmpss_avx512f(auVar11,ZEXT416(0x358637bd),1);
  fVar10 = (float)((uint)!(bool)((byte)uVar1 & 1) * (int)(1.0 / auVar11._0_4_));
  fVar23 = auVar2._0_4_ * fVar10;
  fVar9 = auVar3._0_4_ * fVar10;
  auVar14 = vfmadd213ss_fma(auVar14,ZEXT416((uint)fVar23),ZEXT416((uint)(fVar27 * fVar8 * fVar10)));
  auVar14 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar9),auVar14);
  *plane = fVar23;
  plane[1] = fVar8 * fVar10;
  plane[2] = fVar9;
  plane[3] = 0.0 - auVar14._0_4_;
  return true;
}

Assistant:

bool computeSplitPlane(unsigned int vcount,
                       const float *vertices,
                       unsigned int tcount,
                       const unsigned int *indices,
                       ConvexDecompInterface *callback,
                       float *plane)
{
  float bmin[3] = { 1e9, 1e9, 1e9 };
  float bmax[3] = { -1e9, -1e9, -1e9 };

 	for (unsigned int i=0; i<vcount; i++)
 	{
    const float *p = &vertices[i*3];

 		if ( p[0] < bmin[0] ) bmin[0] = p[0];
 		if ( p[1] < bmin[1] ) bmin[1] = p[1];
 		if ( p[2] < bmin[2] ) bmin[2] = p[2];

 		if ( p[0] > bmax[0] ) bmax[0] = p[0];
 		if ( p[1] > bmax[1] ) bmax[1] = p[1];
 		if ( p[2] > bmax[2] ) bmax[2] = p[2];

  }

  float dx = bmax[0] - bmin[0];
  float dy = bmax[1] - bmin[1];
  float dz = bmax[2] - bmin[2];


	float laxis = dx;

	unsigned int axis = 0;

	if ( dy > dx )
	{
		axis = 1;
		laxis = dy;
	}

	if ( dz > dx && dz > dy )
	{
		axis = 2;
		laxis = dz;
	}

  float p1[3];
  float p2[3];
  float p3[3];

  p3[0] = p2[0] = p1[0] = bmin[0] + dx*0.5f;
  p3[1] = p2[1] = p1[1] = bmin[1] + dy*0.5f;
  p3[2] = p2[2] = p1[2] = bmin[2] + dz*0.5f;

  Rect3d b(bmin,bmax);

  Rect3d b1,b2;

  splitRect(axis,b,b1,b2,p1);


//  callback->ConvexDebugBound(b1.mMin,b1.mMax,0x00FF00);
//  callback->ConvexDebugBound(b2.mMin,b2.mMax,0xFFFF00);

  switch ( axis )
  {
    case 0:
      p2[1] = bmin[1];
      p2[2] = bmin[2];

      if ( dz > dy )
      {
        p3[1] = bmax[1];
        p3[2] = bmin[2];
      }
      else
      {
        p3[1] = bmin[1];
        p3[2] = bmax[2];
      }

      break;
    case 1:
      p2[0] = bmin[0];
      p2[2] = bmin[2];

      if ( dx > dz )
      {
        p3[0] = bmax[0];
        p3[2] = bmin[2];
      }
      else
      {
        p3[0] = bmin[0];
        p3[2] = bmax[2];
      }

      break;
    case 2:
      p2[0] = bmin[0];
      p2[1] = bmin[1];

      if ( dx > dy )
      {
        p3[0] = bmax[0];
        p3[1] = bmin[1];
      }
      else
      {
        p3[0] = bmin[0];
        p3[1] = bmax[1];
      }

      break;
  }

//  callback->ConvexDebugTri(p1,p2,p3,0xFF0000);

	computePlane(p1,p2,p3,plane);

  return true;

}